

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcodeparse.y
# Opt level: O2

int pcodeparseerror(char *s)

{
  PcodeSnippet *pPVar1;
  allocator local_31;
  string local_30 [32];
  
  pPVar1 = pcode;
  std::__cxx11::string::string(local_30,s,&local_31);
  (*(pPVar1->super_PcodeCompile)._vptr_PcodeCompile[5])(pPVar1,0,local_30);
  std::__cxx11::string::~string(local_30);
  return 0;
}

Assistant:

int yyerror(const char *s)

{
  pcode->reportError((const Location *)0,s);
  return 0;
}